

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

string * __thiscall
el::base::TypedConfigurations::resolveFilename
          (string *__return_storage_ptr__,TypedConfigurations *this,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pcVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  string dateTimeFormatSpecifierStr;
  string now;
  string fmt;
  char buff_ [30];
  MillisecondsWidth msWidth;
  timeval currTime;
  stringstream ss;
  char *local_260;
  char *local_258;
  char local_250 [16];
  undefined1 *local_240;
  char *local_238;
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  char *local_218;
  undefined8 local_210;
  char local_208 [16];
  time_t local_1f8;
  undefined6 uStack_1f0;
  undefined2 uStack_1ea;
  undefined6 uStack_1e8;
  undefined8 uStack_1e2;
  MillisecondsWidth local_1d0;
  timeval local_1c8;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  pcVar3 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar3,pcVar3 + filename->_M_string_length);
  local_260 = local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"%datetime","");
  pcVar7 = local_260;
  strlen(local_260);
  uVar5 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)pcVar7,0);
  pcVar7 = local_260;
  if (uVar5 != 0xffffffffffffffff) {
    while (local_260 = pcVar7, uVar5 != 0) {
      if ((__return_storage_ptr__->_M_dataplus)._M_p[uVar5 - 1] != '%') {
        if (uVar5 == 0xffffffffffffffff) goto LAB_0011da9c;
        break;
      }
      strlen(pcVar7);
      uVar5 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)pcVar7,uVar5 + 1);
      pcVar7 = local_260;
    }
    pcVar7 = local_258 + (long)((__return_storage_ptr__->_M_dataplus)._M_p + uVar5);
    local_218 = local_208;
    local_210 = 0;
    local_208[0] = '\0';
    local_220 = paVar1;
    if ((uVar5 < __return_storage_ptr__->_M_string_length) && (*pcVar7 == '{')) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      for (lVar8 = 1; (cVar2 = pcVar7[lVar8], cVar2 != '\0' && (cVar2 != '}')); lVar8 = lVar8 + 1) {
        local_240 = (undefined1 *)CONCAT71(local_240._1_7_,cVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),(char *)&local_240,1);
      }
      std::__cxx11::string::erase((ulong)__return_storage_ptr__,(ulong)(local_258 + uVar5));
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&local_218,(string *)&local_240);
      if (local_240 != local_230) {
        operator_delete(local_240);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
    }
    else {
      local_1b8._0_8_ = local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"%Y-%M-%d_%H-%m","");
      std::__cxx11::string::operator=((string *)&local_218,(string *)local_1b8);
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_);
      }
    }
    pcVar7 = local_218;
    local_1d0.m_width = 3;
    local_1d0.m_offset = 1000;
    gettimeofday(&local_1c8,(__timezone_ptr_t)0x0);
    local_1f8 = local_1c8.tv_sec;
    localtime_r(&local_1f8,(tm *)local_1b8);
    uStack_1e8 = 0;
    uStack_1e2 = 0;
    local_1f8 = 0;
    uStack_1f0 = 0;
    uStack_1ea = 0;
    utils::DateTime::parseFormat
              ((char *)&local_1f8,0x1e,pcVar7,(tm *)local_1b8,
               local_1c8.tv_usec / (long)((ulong)local_1d0 >> 0x20),&local_1d0);
    local_240 = local_230;
    sVar6 = strlen((char *)&local_1f8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_240,&local_1f8,(long)&local_1f8 + sVar6);
    if (local_238 != (char *)0x0) {
      pcVar7 = (char *)0x0;
      do {
        if (local_240[(long)pcVar7] == '/') {
          local_240[(long)pcVar7] = 0x2d;
        }
        pcVar7 = pcVar7 + 1;
      } while (local_238 != pcVar7);
    }
    if ((local_258 != local_238) ||
       ((local_258 != (char *)0x0 &&
        (iVar4 = bcmp(local_260,local_240,(size_t)local_258), iVar4 != 0)))) {
      for (uVar5 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_260,0);
          uVar5 != 0xffffffffffffffff;
          uVar5 = std::__cxx11::string::find
                            ((char *)__return_storage_ptr__,(ulong)local_260,uVar5 + 1)) {
        std::__cxx11::string::replace
                  ((ulong)__return_storage_ptr__,uVar5,local_258,(ulong)local_240);
      }
    }
    if (local_240 != local_230) {
      operator_delete(local_240);
    }
    if (local_218 != local_208) {
      operator_delete(local_218);
    }
  }
LAB_0011da9c:
  if (local_260 != local_250) {
    operator_delete(local_260);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string resolveFilename(const std::string& filename) {
        std::string resultingFilename = filename;
        std::size_t dateIndex = std::string::npos;
        std::string dateTimeFormatSpecifierStr = std::string(base::consts::kDateTimeFormatSpecifierForFilename);
        if ((dateIndex = resultingFilename.find(dateTimeFormatSpecifierStr.c_str())) != std::string::npos) {
            while (dateIndex > 0 && resultingFilename[dateIndex - 1] == base::consts::kFormatSpecifierChar) {
                dateIndex = resultingFilename.find(dateTimeFormatSpecifierStr.c_str(), dateIndex + 1);
            }
            if (dateIndex != std::string::npos) {
                const char* ptr = resultingFilename.c_str() + dateIndex;
                // Goto end of specifier
                ptr += dateTimeFormatSpecifierStr.size();
                std::string fmt;
                if ((resultingFilename.size() > dateIndex) && (ptr[0] == '{')) {
                    // User has provided format for date/time
                    ++ptr;
                    int count = 1;  // Start by 1 in order to remove starting brace
                    std::stringstream ss;
                    for (; *ptr; ++ptr, ++count) {
                        if (*ptr == '}') {
                            ++count;  // In order to remove ending brace
                            break;
                        }
                        ss << *ptr;
                    }
                    resultingFilename.erase(dateIndex + dateTimeFormatSpecifierStr.size(), count);
                    fmt = ss.str();
                } else {
                    fmt = std::string(base::consts::kDefaultDateTimeFormatInFilename);
                }
                base::MillisecondsWidth msWidth(3);
                std::string now = base::utils::DateTime::getDateTime(fmt.c_str(), &msWidth);
                base::utils::Str::replaceAll(now, '/', '-'); // Replace path element since we are dealing with filename
                base::utils::Str::replaceAll(resultingFilename, dateTimeFormatSpecifierStr, now);
            }
        }
        return resultingFilename;
    }